

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glloader.c
# Opt level: O0

ktx_error_code_e
ktxTexture_GLUploadPrivate
          (ktxTexture *This,ktx_glformatinfo *formatInfo,GLuint *pTexture,GLenum *pTarget,
          GLenum *pGlerror)

{
  ktx_bool_t kVar1;
  ktxTexture *in_RCX;
  GLuint *in_RDX;
  undefined4 *in_RSI;
  long in_RDI;
  PFNKTXITERCB in_R8;
  int dimensions;
  PFNKTXITERCB iterCb;
  ktx_cbdata cbData;
  ktx_error_code_e result;
  int texnameUser;
  GLenum target;
  GLuint texname;
  int in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  bool local_65;
  int local_64;
  code *local_60;
  class_id local_58;
  undefined4 local_54;
  undefined4 local_50;
  undefined4 local_4c;
  int local_48;
  undefined4 local_44;
  ktx_error_code_e local_40;
  uint local_3c;
  class_id cVar2;
  GLuint in_stack_ffffffffffffffcc;
  ktx_error_code_e local_4;
  
  cVar2 = 0xde1;
  local_40 = 0;
  local_60 = (code *)0x0;
  if (in_R8 != (PFNKTXITERCB)0x0) {
    *(undefined4 *)in_R8 = 0;
  }
  if ((in_RDI != 0) && (in_RCX != (ktxTexture *)0x0)) {
    if (contextProfile == 0) {
      discoverContextCapabilities();
    }
    local_65 = false;
    if (in_RDX != (GLuint *)0x0) {
      local_65 = *in_RDX != 0;
    }
    local_3c = (uint)local_65;
    if (local_3c == 0) {
      (*gl.glGenTextures)(1,(GLuint *)&stack0xffffffffffffffcc);
    }
    else {
      in_stack_ffffffffffffffcc = *in_RDX;
    }
    local_54 = *in_RSI;
    local_50 = in_RSI[1];
    local_4c = in_RSI[3];
    local_64 = *(int *)(in_RDI + 0x30);
    if ((*(byte *)(in_RDI + 0x20) & 1) == 0) {
      if (*(int *)(in_RDI + 0x3c) == 6) {
        if (*(int *)(in_RDI + 0x30) != 2) {
          __assert_fail("This->numDimensions == 2",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/glloader.c"
                        ,0x2e9,
                        "ktx_error_code_e ktxTexture_GLUploadPrivate(ktxTexture *, ktx_glformatinfo *, GLuint *, GLenum *, GLenum *)"
                       );
        }
        cVar2 = 0x8513;
      }
      else {
        in_stack_ffffffffffffff90 = *(int *)(in_RDI + 0x30);
        if (in_stack_ffffffffffffff90 == 1) {
          cVar2 = 0xde0;
        }
        else if (in_stack_ffffffffffffff90 == 2) {
          cVar2 = 0xde1;
        }
        else if (in_stack_ffffffffffffff90 == 3) {
          cVar2 = 0x806f;
        }
      }
      local_44 = 0;
    }
    else {
      local_64 = local_64 + 1;
      if (*(int *)(in_RDI + 0x3c) == 6) {
        if (*(int *)(in_RDI + 0x30) != 2) {
          __assert_fail("This->numDimensions == 2",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/glloader.c"
                        ,0x2db,
                        "ktx_error_code_e ktxTexture_GLUploadPrivate(ktxTexture *, ktx_glformatinfo *, GLuint *, GLenum *, GLenum *)"
                       );
        }
        cVar2 = 0x9009;
      }
      else {
        in_stack_ffffffffffffff94 = *(int *)(in_RDI + 0x30);
        if (in_stack_ffffffffffffff94 == 1) {
          cVar2 = 0x8c18;
        }
        else if (in_stack_ffffffffffffff94 == 2) {
          cVar2 = 0x8c1a;
        }
      }
      local_44 = *(undefined4 *)(in_RDI + 0x38);
    }
    if ((cVar2 == 0xde0) &&
       ((((*(byte *)(in_RDI + 0x22) & 1) != 0 &&
         (gl.glCompressedTexImage1D == (PFNGLCOMPRESSEDTEXIMAGE1DPROC)0x0)) ||
        (((*(byte *)(in_RDI + 0x22) & 1) == 0 && (gl.glTexImage1D == (PFNGLTEXIMAGE1DPROC)0x0))))))
    {
      local_4 = KTX_UNSUPPORTED_TEXTURE_TYPE;
    }
    else if ((cVar2 == 0x806f) &&
            ((((*(byte *)(in_RDI + 0x22) & 1) != 0 &&
              (gl.glCompressedTexImage3D == (PFNGLCOMPRESSEDTEXIMAGE3DPROC)0x0)) ||
             (((*(byte *)(in_RDI + 0x22) & 1) == 0 && (gl.glTexImage3D == (PFNGLTEXIMAGE3DPROC)0x0))
             )))) {
      local_4 = KTX_UNSUPPORTED_TEXTURE_TYPE;
    }
    else if ((cVar2 == 0x9009) && (supportsCubeMapArrays == '\0')) {
      local_4 = KTX_UNSUPPORTED_TEXTURE_TYPE;
    }
    else {
      if (local_64 == 1) {
        local_60 = texImage1DCallback;
        if ((*(byte *)(in_RDI + 0x22) & 1) != 0) {
          local_60 = compressedTexImage1DCallback;
        }
      }
      else if (local_64 == 2) {
        local_60 = texImage2DCallback;
        if ((*(byte *)(in_RDI + 0x22) & 1) != 0) {
          local_60 = compressedTexImage2DCallback;
        }
      }
      else if ((local_64 == 3) &&
              (local_60 = texImage3DCallback, (*(byte *)(in_RDI + 0x22) & 1) != 0)) {
        local_60 = compressedTexImage3DCallback;
      }
      (*gl.glBindTexture)(cVar2,in_stack_ffffffffffffffcc);
      if (((*(byte *)(in_RDI + 0x23) & 1) != 0) &&
         (gl.glGenerateMipmap == (PFNGLGENERATEMIPMAPPROC)0x0)) {
        (*gl.glTexParameteri)(cVar2,0x8191,1);
      }
      if (((*(byte *)(in_RDI + 0x23) & 1) == 0) && (supportsMaxLevel != '\0')) {
        (*gl.glTexParameteri)(cVar2,0x813d,*(int *)(in_RDI + 0x34) + -1);
      }
      local_58 = cVar2;
      if (cVar2 == 0x8513) {
        local_58 = 0x8515;
      }
      if (((*(byte *)(in_RDI + 0x22) & 1) == 0) &&
         ((sizedFormats == 0 ||
          (((sizedFormats & 2U) == 0 &&
           ((((in_RSI[2] == 0x1906 || (in_RSI[2] == 0x1909)) || (in_RSI[2] == 0x190a)) ||
            (in_RSI[2] == 0x8049)))))))) {
        local_50 = in_RSI[2];
      }
      kVar1 = ktxTexture_isActiveStream
                        ((ktxTexture *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90)
                        );
      if (kVar1) {
        local_40 = (**(code **)(*(long *)(in_RDI + 8) + 0x30))(in_RDI,local_60,&local_58);
      }
      else {
        local_40 = ktxTexture_IterateLevelFaces
                             (in_RCX,in_R8,(void *)CONCAT44(in_stack_ffffffffffffffcc,cVar2));
      }
      if (((local_40 != KTX_SUCCESS) && (local_48 != 0)) && (in_R8 != (PFNKTXITERCB)0x0)) {
        *(int *)in_R8 = local_48;
      }
      if (local_40 == KTX_SUCCESS) {
        if (((*(byte *)(in_RDI + 0x23) & 1) != 0) &&
           (gl.glGenerateMipmap != (PFNGLGENERATEMIPMAPPROC)0x0)) {
          (*gl.glGenerateMipmap)(cVar2);
        }
        in_RCX->classId = cVar2;
        if (in_RDX != (GLuint *)0x0) {
          *in_RDX = in_stack_ffffffffffffffcc;
        }
      }
      else if (local_3c == 0) {
        (*gl.glDeleteTextures)(1,(GLuint *)&stack0xffffffffffffffcc);
      }
      local_4 = local_40;
    }
    return local_4;
  }
  __assert_fail("This && pTarget",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/glloader.c"
                ,0x2c6,
                "ktx_error_code_e ktxTexture_GLUploadPrivate(ktxTexture *, ktx_glformatinfo *, GLuint *, GLenum *, GLenum *)"
               );
}

Assistant:

KTX_error_code
ktxTexture_GLUploadPrivate(ktxTexture* This, ktx_glformatinfo* formatInfo,
                           GLuint* pTexture, GLenum* pTarget, GLenum* pGlerror)
{
    GLuint                texname;
    GLenum                target = GL_TEXTURE_2D;
    int                   texnameUser;
    KTX_error_code        result = KTX_SUCCESS;
    ktx_cbdata            cbData;
    PFNKTXITERCB          iterCb = NULL;
    int                   dimensions;

    if (pGlerror)
        *pGlerror = GL_NO_ERROR;

    assert(This && pTarget);

    if (contextProfile == 0)
        discoverContextCapabilities();

    texnameUser = pTexture && *pTexture;
    if (texnameUser) {
        texname = *pTexture;
    } else {
        glGenTextures(1, &texname);
    }

    cbData.glFormat = formatInfo->glFormat;
    cbData.glInternalformat = formatInfo->glInternalformat;
    cbData.glType = formatInfo->glType;

    dimensions = This->numDimensions;
    if (This->isArray) {
        dimensions += 1;
        if (This->numFaces == 6) {
            /* ktxCheckHeader1_ should have caught this. */
            assert(This->numDimensions == 2);
            target = GL_TEXTURE_CUBE_MAP_ARRAY;
        } else {
            switch (This->numDimensions) {
              case 1: target = GL_TEXTURE_1D_ARRAY; break;
              case 2: target = GL_TEXTURE_2D_ARRAY; break;
              /* _ktxCheckHeader should have caught this. */
              default: assert(KTX_TRUE);
            }
        }
        cbData.numLayers = This->numLayers;
    } else {
        if (This->numFaces == 6) {
            /* ktxCheckHeader1_ should have caught this. */
            assert(This->numDimensions == 2);
            target = GL_TEXTURE_CUBE_MAP;
        } else {
            switch (This->numDimensions) {
              case 1: target = GL_TEXTURE_1D; break;
              case 2: target = GL_TEXTURE_2D; break;
              case 3: target = GL_TEXTURE_3D; break;
              /* _ktxCheckHeader shold have caught this. */
              default: assert(KTX_TRUE);
            }
        }
        cbData.numLayers = 0;
    }

    if (target == GL_TEXTURE_1D &&
        ((This->isCompressed && (gl.glCompressedTexImage1D == NULL)) ||
         (!This->isCompressed && (gl.glTexImage1D == NULL))))
    {
        return KTX_UNSUPPORTED_TEXTURE_TYPE;
    }

    /* Reject 3D texture if unsupported. */
    if (target == GL_TEXTURE_3D &&
        ((This->isCompressed && (gl.glCompressedTexImage3D == NULL)) ||
         (!This->isCompressed && (gl.glTexImage3D == NULL))))
    {
        return KTX_UNSUPPORTED_TEXTURE_TYPE;
    }

    /* Reject cube map arrays if not supported. */
    if (target == GL_TEXTURE_CUBE_MAP_ARRAY && !supportsCubeMapArrays) {
        return KTX_UNSUPPORTED_TEXTURE_TYPE;
    }

    /* XXX Need to reject other array textures & cube maps if not supported. */

    switch (dimensions) {
      case 1:
        iterCb = This->isCompressed
                  ? compressedTexImage1DCallback : texImage1DCallback;
        break;
      case 2:
        iterCb = This->isCompressed
                  ? compressedTexImage2DCallback : texImage2DCallback;
            break;
      case 3:
        iterCb = This->isCompressed
                  ? compressedTexImage3DCallback : texImage3DCallback;
        break;
      default:
            assert(KTX_TRUE);
    }

    glBindTexture(target, texname);

    // Prefer glGenerateMipmaps over GL_GENERATE_MIPMAP
    if (This->generateMipmaps && (gl.glGenerateMipmap == NULL)) {
        glTexParameteri(target, GL_GENERATE_MIPMAP, GL_TRUE);
    }

    if (!This->generateMipmaps && supportsMaxLevel)
        glTexParameteri(target, GL_TEXTURE_MAX_LEVEL, This->numLevels - 1);

    if (target == GL_TEXTURE_CUBE_MAP) {
        cbData.glTarget = GL_TEXTURE_CUBE_MAP_POSITIVE_X;
    } else {
        cbData.glTarget = target;
    }

    if (!This->isCompressed) {
#if SUPPORT_LEGACY_FORMAT_CONVERSION
        // If sized legacy formats are supported there is no need to convert.
        // If only unsized formats are supported, there is no point in
        // converting as the modern formats aren't supported either.
        if (sizedFormats == _NON_LEGACY_FORMATS && supportsSwizzle) {
            convertFormat(target, &cbData.glFormat, &cbData.glInternalformat);
        } else if (sizedFormats == _NO_SIZED_FORMATS)
            cbData.glInternalformat = formatInfo->glBaseInternalformat;
#else
        // When no sized formats are supported, or legacy sized formats are not
        // supported, must change internal format.
        if (sizedFormats == _NO_SIZED_FORMATS
            || (!(sizedFormats & _LEGACY_FORMATS) &&
                (formatInfo->glBaseInternalformat == GL_ALPHA
                || formatInfo->glBaseInternalformat == GL_LUMINANCE
                || formatInfo->glBaseInternalformat == GL_LUMINANCE_ALPHA
                || formatInfo->glBaseInternalformat == GL_INTENSITY))) {
            cbData.glInternalformat = formatInfo->glBaseInternalformat;
        }
#endif
    }

    if (ktxTexture_isActiveStream(ktxTexture(This)))
        result = ktxTexture_IterateLoadLevelFaces(This, iterCb, &cbData);
    else
        result = ktxTexture_IterateLevelFaces(This, iterCb, &cbData);

    /* GL errors are the only reason for failure. */
    if (result != KTX_SUCCESS && cbData.glError != GL_NO_ERROR) {
        if (pGlerror)
            *pGlerror = cbData.glError;
    }

    if (result == KTX_SUCCESS)
    {
        // Prefer glGenerateMipmaps over GL_GENERATE_MIPMAP
        if (This->generateMipmaps && gl.glGenerateMipmap) {
            gl.glGenerateMipmap(target);
        }
        *pTarget = target;
        if (pTexture) {
            *pTexture = texname;
        }
    } else if (!texnameUser) {
        glDeleteTextures(1, &texname);
    }
    return result;
}